

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

void DumpClassMap(FClassMap *themap)

{
  bool bVar1;
  hash_t hVar2;
  void *__base;
  int j;
  size_t sVar3;
  size_t __nmemb;
  Pair *pair;
  Iterator it;
  
  it.Position = 0;
  it.Map = themap;
  hVar2 = TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::CountUsed
                    (themap);
  __base = operator_new__((ulong)hVar2 << 3);
  __nmemb = 0;
  while( true ) {
    bVar1 = TMapIterator<int,_PClassActor_*,_TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>_>
            ::NextPair(&it,&pair);
    if (!bVar1) break;
    *(Pair **)((long)__base + __nmemb * 8) = pair;
    __nmemb = __nmemb + 1;
  }
  qsort(__base,__nmemb,8,SpawnableSort);
  for (sVar3 = 0; __nmemb != sVar3; sVar3 = sVar3 + 1) {
    pair = *(Pair **)((long)__base + sVar3 * 8);
    Printf("%d %s\n",(ulong)(uint)pair->Key,
           FName::NameData.NameArray
           [(pair->Value->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
            Index].Text);
  }
  operator_delete__(__base);
  return;
}

Assistant:

static void DumpClassMap(FClassMap &themap)
{
	FClassMap::Iterator it(themap);
	FClassMap::Pair *pair, **allpairs;
	int i = 0;

	// Sort into numerical order, since their arrangement in the map can
	// be in an unspecified order.
	allpairs = new FClassMap::Pair *[themap.CountUsed()];
	while (it.NextPair(pair))
	{
		allpairs[i++] = pair;
	}
	qsort(allpairs, i, sizeof(*allpairs), SpawnableSort);
	for (int j = 0; j < i; ++j)
	{
		pair = allpairs[j];
		Printf ("%d %s\n", pair->Key, pair->Value->TypeName.GetChars());
	}
	delete[] allpairs;
}